

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::addTestToRunBasedOnVerboseOutput
          (CommandLineArguments *this,int ac,char **av,int *index,char *parameterName)

{
  char cVar1;
  TestFilter *this_00;
  TestFilter *this_01;
  TestFilter *pTVar2;
  int *in_RCX;
  SimpleString *in_RDX;
  SimpleString *in_RDI;
  TestFilter *groupfilter;
  TestFilter *namefilter;
  SimpleString testname;
  SimpleString wholename;
  SimpleString *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  SimpleString *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff30;
  undefined2 uVar3;
  char **av_00;
  int in_stack_ffffffffffffff64;
  CommandLineArguments *in_stack_ffffffffffffff68;
  char *local_48 [9];
  
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  av_00 = local_48;
  SimpleString::SimpleString(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  getParameterField(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,av_00,in_RCX,in_RDX);
  SimpleString::~SimpleString((SimpleString *)0x18812e);
  SimpleString::subStringFromTill(in_RDI,(char)((ushort)uVar3 >> 8),(char)uVar3);
  SimpleString::subString(in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  SimpleString::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SimpleString::~SimpleString((SimpleString *)0x18818f);
  this_00 = (TestFilter *)
            operator_new((size_t)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                         0x1881a5);
  TestFilter::TestFilter
            ((TestFilter *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  pTVar2 = this_00;
  this_01 = (TestFilter *)
            operator_new((size_t)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                         0x1881e0);
  uVar3 = (undefined2)((ulong)pTVar2 >> 0x30);
  cVar1 = SimpleString::at(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  SimpleString::subStringFromTill(in_RDI,(char)((ushort)uVar3 >> 8),(char)uVar3);
  TestFilter::TestFilter
            ((TestFilter *)CONCAT17(cVar1,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
  SimpleString::~SimpleString((SimpleString *)0x188243);
  TestFilter::strictMatching(this_00);
  TestFilter::strictMatching(this_01);
  pTVar2 = TestFilter::add(this_01,(TestFilter *)in_RDI[3].bufferSize_);
  in_RDI[3].bufferSize_ = (size_t)pTVar2;
  pTVar2 = TestFilter::add(this_00,(TestFilter *)in_RDI[4].buffer_);
  in_RDI[4].buffer_ = (char *)pTVar2;
  SimpleString::~SimpleString((SimpleString *)0x1882bd);
  SimpleString::~SimpleString((SimpleString *)0x1882ca);
  return;
}

Assistant:

void CommandLineArguments::addTestToRunBasedOnVerboseOutput(int ac, const char *const *av, int& index, const char* parameterName)
{
    SimpleString wholename = getParameterField(ac, av, index, parameterName);
    SimpleString testname = wholename.subStringFromTill(',', ')');
    testname = testname.subString(2);
    TestFilter* namefilter = new TestFilter(testname);
    TestFilter* groupfilter = new TestFilter(wholename.subStringFromTill(wholename.at(0), ','));
    namefilter->strictMatching();
    groupfilter->strictMatching();
    groupFilters_ = groupfilter->add(groupFilters_);
    nameFilters_ = namefilter->add(nameFilters_);
}